

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByTessellationQueryCase::iterate
          (ReferencedByTessellationQueryCase *this)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  GLenum err_00;
  TestLog *pTVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  Context *pCVar8;
  ProgramSources *pPVar9;
  MessageBuilder *pMVar10;
  char *in_RCX;
  Enum<int,_2UL> EVar11;
  allocator<char> local_cc1;
  string local_cc0;
  GetNameFunc local_ca0;
  int local_c98;
  Enum<int,_2UL> local_c90;
  GetNameFunc local_c80;
  int local_c78;
  Enum<int,_2UL> local_c70;
  MessageBuilder local_c60;
  allocator<char> local_ad9;
  string local_ad8;
  MessageBuilder local_ab8;
  GLint local_938;
  GLsizei local_934;
  GLint referenced_1;
  GLsizei length_1;
  deUint32 resourcePos_1;
  allocator<char> local_901;
  string local_900;
  ScopedLogSection local_8e0;
  ScopedLogSection section_1;
  string local_8d0;
  GetNameFunc local_8b0;
  int local_8a8;
  GetNameFunc local_8a0;
  int local_898;
  string local_890;
  allocator<char> local_869;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  GLenum local_7e4;
  GetNameFunc p_Stack_7e0;
  deUint32 err;
  int local_7d8;
  Enum<int,_2UL> local_7d0;
  GetNameFunc local_7c0;
  int local_7b8;
  Enum<int,_2UL> local_7b0;
  MessageBuilder local_7a0;
  allocator<char> local_619;
  string local_618;
  MessageBuilder local_5f8;
  GLint local_478;
  GLsizei local_474;
  GLint referenced;
  GLsizei length;
  deUint32 resourcePos;
  allocator<char> local_441;
  string local_440;
  ScopedLogSection local_420;
  ScopedLogSection section;
  deUint32 props [1];
  string local_3f0;
  string local_3d0;
  ShaderSource local_3b0;
  string local_388;
  string local_368;
  ShaderSource local_348;
  string local_320;
  string local_300;
  ShaderSource local_2e0;
  string local_2b8;
  string local_298;
  ShaderSource local_278;
  ProgramSources local_250;
  undefined1 local_180 [8];
  ShaderProgram program;
  CallLogWrapper gl;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  ReferencedByTessellationQueryCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,pTVar6,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_250);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ReferencedByTessellationQueryCase::getVertexSource_abi_cxx11_
            (&local_2b8,this);
  pCVar8 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_298,(_anonymous_namespace_ *)pCVar1,pCVar8,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_278,&local_298);
  pPVar9 = glu::ProgramSources::operator<<(&local_250,&local_278);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ReferencedByTessellationQueryCase::getFragmentSource_abi_cxx11_
            (&local_320,this);
  pCVar8 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)pCVar1,pCVar8,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_2e0,&local_300);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_2e0);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ReferencedByTessellationQueryCase::getTessCtrlSource_abi_cxx11_
            (&local_388,this);
  pCVar8 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_368,(_anonymous_namespace_ *)pCVar1,pCVar8,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_348,&local_368);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_348);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ReferencedByTessellationQueryCase::getTessEvalSource_abi_cxx11_
            (&local_3f0,this);
  pCVar8 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3d0,(_anonymous_namespace_ *)pCVar1,pCVar8,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3b0,&local_3d0);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_3b0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_180,pRVar7,pPVar9);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  glu::VertexSource::~VertexSource((VertexSource *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  glu::ProgramSources::~ProgramSources(&local_250);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar6,(ShaderProgram *)local_180);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_180);
  if (bVar2) {
    section.m_log._0_4_ = 0x9308 - (this->m_isCtrlCase & 1);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"UnreferencedUniform",&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resourcePos,"Unreferenced uniform u_unreferenced",
               (allocator<char> *)((long)&length + 3));
    tcu::ScopedLogSection::ScopedLogSection(&local_420,pTVar6,&local_440,(string *)&resourcePos);
    std::__cxx11::string::~string((string *)&resourcePos);
    std::allocator<char>::~allocator((allocator<char> *)((long)&length + 3));
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    local_474 = 0;
    local_478 = 0;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
    referenced = glu::CallLogWrapper::glGetProgramResourceIndex
                           ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,dVar4,0x92e1,
                            "u_unreferenced");
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5f8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_5f8,(char (*) [32])"u_unreferenced resource index: ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)&referenced);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5f8);
    if (referenced == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"resourcePos was GL_INVALID_INDEX",&local_619);
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator(&local_619);
    }
    else {
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
      glu::CallLogWrapper::glGetProgramResourceiv
                ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,dVar4,0x92e1,referenced,1,
                 (GLenum *)&section,1,&local_474,&local_478);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_7a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_7a0,(char (*) [7])"Query ");
      EVar11 = glu::getProgramResourcePropertyStr((int)section.m_log);
      local_7c0 = EVar11.m_getName;
      local_7b8 = EVar11.m_value;
      local_7b0.m_getName = local_7c0;
      local_7b0.m_value = local_7b8;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_7b0);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [7])0x2c59494);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_474);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [23])" value(s), value[0] = ");
      EVar11 = glu::getBooleanStr(local_478);
      p_Stack_7e0 = EVar11.m_getName;
      local_7d8 = EVar11.m_value;
      local_7d0.m_getName = p_Stack_7e0;
      local_7d0.m_value = local_7d8;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_7d0);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7a0);
      do {
        local_7e4 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
        if (local_7e4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_868,"Got Error ",&local_869);
          EVar11 = glu::getErrorStr(local_7e4);
          local_8b0 = EVar11.m_getName;
          local_8a8 = EVar11.m_value;
          local_8a0 = local_8b0;
          local_898 = local_8a8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_890,&local_8a0);
          std::operator+(&local_848,&local_868,&local_890);
          std::operator+(&local_828,&local_848,": ");
          std::operator+(&local_808,&local_828,"query resource");
          tcu::ResultCollector::fail((ResultCollector *)local_60,&local_808);
          std::__cxx11::string::~string((string *)&local_808);
          std::__cxx11::string::~string((string *)&local_828);
          std::__cxx11::string::~string((string *)&local_848);
          std::__cxx11::string::~string((string *)&local_890);
          std::__cxx11::string::~string((string *)&local_868);
          std::allocator<char>::~allocator(&local_869);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      if ((local_474 == 0) || (local_478 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8d0,"expected GL_FALSE",
                   (allocator<char> *)((long)&section_1.m_log + 7));
        tcu::ResultCollector::fail((ResultCollector *)local_60,&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_420);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"ReferencedUniform",&local_901);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resourcePos_1,"Referenced uniform u_referenced",
               (allocator<char> *)((long)&length_1 + 3));
    tcu::ScopedLogSection::ScopedLogSection(&local_8e0,pTVar6,&local_900,(string *)&resourcePos_1);
    std::__cxx11::string::~string((string *)&resourcePos_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&length_1 + 3));
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
    local_934 = 0;
    local_938 = 0;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
    referenced_1 = glu::CallLogWrapper::glGetProgramResourceIndex
                             ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,dVar4,0x92e1,
                              "u_referenced");
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_ab8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_ab8,(char (*) [30])"u_referenced resource index: ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(uint *)&referenced_1);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_ab8);
    if (referenced_1 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"resourcePos was GL_INVALID_INDEX",&local_ad9);
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_ad8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
    }
    else {
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
      glu::CallLogWrapper::glGetProgramResourceiv
                ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,dVar4,0x92e1,referenced_1,1,
                 (GLenum *)&section,1,&local_934,&local_938);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_c60,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_c60,(char (*) [7])"Query ");
      EVar11 = glu::getProgramResourcePropertyStr((int)section.m_log);
      local_c80 = EVar11.m_getName;
      local_c78 = EVar11.m_value;
      local_c70.m_getName = local_c80;
      local_c70.m_value = local_c78;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_c70);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [7])0x2c59494);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_934);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [23])" value(s), value[0] = ");
      EVar11 = glu::getBooleanStr(local_938);
      local_ca0 = EVar11.m_getName;
      local_c98 = EVar11.m_value;
      local_c90.m_getName = local_ca0;
      local_c90.m_value = local_c98;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_c90);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c60);
      err_00 = glu::CallLogWrapper::glGetError
                         ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
      glu::checkError(err_00,"query resource",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x1ba5);
      if ((local_934 == 0) || (local_938 != 1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cc0,"expected GL_TRUE",&local_cc1);
        tcu::ResultCollector::fail((ResultCollector *)local_60,&local_cc0);
        std::__cxx11::string::~string((string *)&local_cc0);
        std::allocator<char>::~allocator(&local_cc1);
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_8e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)props,"failed to build program",
               (allocator<char> *)((long)&section.m_log + 7));
    tcu::ResultCollector::fail((ResultCollector *)local_60,(string *)props);
    std::__cxx11::string::~string((string *)props);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_180);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

ReferencedByTessellationQueryCase::IterateResult ReferencedByTessellationQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram		program	(m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource().c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource().c_str())));

	gl.enableLogging(true);

	m_testCtx.getLog() << program;
	if (!program.isOk())
		result.fail("failed to build program");
	else
	{
		const deUint32 props[1] = { (deUint32)((m_isCtrlCase) ? (GL_REFERENCED_BY_TESS_CONTROL_SHADER) : (GL_REFERENCED_BY_TESS_EVALUATION_SHADER)) };

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_unreferenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_unreferenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_unreferenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_FALSE)
					result.fail("expected GL_FALSE");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_referenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_referenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_referenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_TRUE)
					result.fail("expected GL_TRUE");
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}